

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O3

void __thiscall SQCompilation::SQParser::checkSuspiciousBracket(SQParser *this)

{
  char *pcVar1;
  char op [2];
  undefined8 uStack_8;
  
  if ((((this->_expression_context | SQE_SWITCH) == SQE_ARRAY_ELEM) &&
      ((this->_lex)._prevtoken != 0x2c)) && (((this->_lex)._prevflags & 3) != 0)) {
    uStack_8._0_7_ = CONCAT16((char)this->_token,6);
    uStack_8 = (ulong)(uint7)uStack_8;
    pcVar1 = "access to member";
    if (this->_token == 0x28) {
      pcVar1 = "function call";
    }
    reportDiagnostic(this,0x6c,(long)&uStack_8 + 6,pcVar1);
  }
  return;
}

Assistant:

void SQParser::checkSuspiciousBracket() {
  assert(_token == _SC('(') || _token == _SC('['));
  if (_expression_context == SQE_ARRAY_ELEM || _expression_context == SQE_FUNCTION_ARG) {
    if (_lex._prevtoken != _SC(',')) {
      if (_lex._prevflags & (TF_PREP_EOL | TF_PREP_SPACE)) {
        char op[] = { (char)_token, '\0' };
        reportDiagnostic(DiagnosticsId::DI_SUSPICIOUS_BRACKET, op, _token == _SC('(') ? "function call" : "access to member");
      }
    }
  }
}